

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

void StartREST(any *context)

{
  __0 *this;
  long lVar1;
  long in_FS_OFFSET;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  allocator<char> local_79;
  anon_class_32_2_05f9280c handler;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x10) {
    std::any::any(&handler.context,context);
    handler.up.prefix = *(char **)((long)&uri_prefixes[0].prefix + lVar1);
    handler.up.handler =
         *(_func_bool_any_ptr_HTTPRequest_ptr_string_ptr **)((long)&uri_prefixes[0].handler + lVar1)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,*(char **)((long)&uri_prefixes[0].prefix + lVar1),&local_79);
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    this = (__0 *)operator_new(0x20);
    StartREST(std::any_const&)::$_0::__0(this,&handler);
    pcStack_90 = std::
                 _Function_handler<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp:1027:24)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp:1027:24)>
               ::_M_manager;
    local_a8._M_unused._0_8_ = (undefined8)this;
    RegisterHTTPHandler(&local_58,false,(HTTPRequestHandler *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    std::__cxx11::string::~string((string *)&local_58);
    std::any::reset(&handler.context);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartREST(const std::any& context)
{
    for (const auto& up : uri_prefixes) {
        auto handler = [context, up](HTTPRequest* req, const std::string& prefix) { return up.handler(context, req, prefix); };
        RegisterHTTPHandler(up.prefix, false, handler);
    }
}